

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

void __thiscall QScroller::QScroller(QScroller *this,QObject *target)

{
  QScrollerPrivate *this_00;
  
  QObject::QObject(&this->super_QObject,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_00823a00;
  this_00 = (QScrollerPrivate *)operator_new(0x1a8);
  QScrollerPrivate::QScrollerPrivate(this_00,this,target);
  this->d_ptr = this_00;
  QObject::setParent(&this->super_QObject);
  QScrollerPrivate::setDpiFromWidget(this->d_ptr,(QWidget *)0x0);
  QElapsedTimer::start();
  return;
}

Assistant:

QScroller::QScroller(QObject *target)
    : d_ptr(new QScrollerPrivate(this, target))
{
    Q_ASSERT(target); // you can't create a scroller without a target in any normal way
    setParent(target);
    Q_D(QScroller);
    d->init();
}